

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_shar.c
# Opt level: O0

int archive_write_shar_finish_entry(archive_write *a)

{
  int iVar1;
  mode_t mVar2;
  char *pcVar3;
  char *pcVar4;
  long in_RDI;
  int r;
  int ret;
  shar *shar;
  char *u;
  char *p;
  char *g;
  archive_entry *in_stack_ffffffffffffffa8;
  archive_write *in_stack_ffffffffffffffb0;
  archive_entry *entry;
  size_t in_stack_ffffffffffffffc0;
  archive_string *buf;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  shar *shar_00;
  archive_write *in_stack_ffffffffffffffd8;
  int local_4;
  
  shar_00 = *(shar **)(in_RDI + 0xd0);
  if (shar_00->entry == (archive_entry *)0x0) {
    local_4 = 0;
  }
  else {
    if (shar_00->dump == 0) {
      if (shar_00->has_data != 0) {
        if (shar_00->end_of_line == 0) {
          archive_strappend_char
                    ((archive_string *)in_stack_ffffffffffffffb0,
                     (char)((ulong)in_stack_ffffffffffffffa8 >> 0x38));
        }
        archive_strcat((archive_string *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      }
    }
    else {
      if (shar_00->has_data != 0) {
        if ((shar_00->outpos != 0) &&
           (iVar1 = _uuencode_line(in_stack_ffffffffffffffd8,shar_00,
                                   (char *)CONCAT44(in_stack_ffffffffffffffcc,
                                                    in_stack_ffffffffffffffc8),
                                   in_stack_ffffffffffffffc0), iVar1 != 0)) {
          return -0x1e;
        }
        archive_strcat((archive_string *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
        archive_strcat((archive_string *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      }
      entry = (archive_entry *)&shar_00->work;
      mVar2 = archive_entry_mode(shar_00->entry);
      archive_string_sprintf((archive_string *)entry,"chmod %o ",(ulong)(mVar2 & 0xfff));
      buf = &shar_00->work;
      archive_entry_pathname(in_stack_ffffffffffffffa8);
      shar_quote(buf,(char *)entry,(int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
      archive_strcat((archive_string *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      pcVar3 = archive_entry_uname(in_stack_ffffffffffffffa8);
      pcVar4 = archive_entry_gname(in_stack_ffffffffffffffa8);
      if ((pcVar3 != (char *)0x0) || (pcVar4 != (char *)0x0)) {
        archive_strcat((archive_string *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
        if (pcVar3 != (char *)0x0) {
          shar_quote(buf,(char *)entry,(int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
        }
        if (pcVar4 != (char *)0x0) {
          archive_strcat((archive_string *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
          shar_quote(buf,(char *)entry,(int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
        }
        archive_strcat((archive_string *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
        in_stack_ffffffffffffffb0 = (archive_write *)&shar_00->work;
        archive_entry_pathname(in_stack_ffffffffffffffa8);
        shar_quote(buf,(char *)entry,(int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
        archive_strcat((archive_string *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      }
      pcVar3 = archive_entry_fflags_text(entry);
      if (pcVar3 != (char *)0x0) {
        archive_string_sprintf(&shar_00->work,"chflags %s ",pcVar3);
        in_stack_ffffffffffffffa8 = (archive_entry *)&shar_00->work;
        archive_entry_pathname(in_stack_ffffffffffffffa8);
        shar_quote(buf,(char *)entry,(int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
        archive_strcat((archive_string *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      }
    }
    archive_entry_free((archive_entry *)0x2b63cd);
    shar_00->entry = (archive_entry *)0x0;
    if ((shar_00->work).length < 0x10000) {
      local_4 = 0;
    }
    else {
      iVar1 = __archive_write_output(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,0x2b640f);
      if (iVar1 == 0) {
        (shar_00->work).length = 0;
        local_4 = 0;
      }
      else {
        local_4 = -0x1e;
      }
    }
  }
  return local_4;
}

Assistant:

static int
archive_write_shar_finish_entry(struct archive_write *a)
{
	const char *g, *p, *u;
	struct shar *shar;
	int ret;

	shar = (struct shar *)a->format_data;
	if (shar->entry == NULL)
		return (0);

	if (shar->dump) {
		/* Finish uuencoded data. */
		if (shar->has_data) {
			if (shar->outpos > 0)
				uuencode_line(a, shar, shar->outbuff,
				    shar->outpos);
			archive_strcat(&shar->work, "`\nend\n");
			archive_strcat(&shar->work, "SHAR_END\n");
		}
		/* Restore file mode, owner, flags. */
		/*
		 * TODO: Don't immediately restore mode for
		 * directories; defer that to end of script.
		 */
		archive_string_sprintf(&shar->work, "chmod %o ",
		    (unsigned int)(archive_entry_mode(shar->entry) & 07777));
		shar_quote(&shar->work, archive_entry_pathname(shar->entry), 1);
		archive_strcat(&shar->work, "\n");

		u = archive_entry_uname(shar->entry);
		g = archive_entry_gname(shar->entry);
		if (u != NULL || g != NULL) {
			archive_strcat(&shar->work, "chown ");
			if (u != NULL)
				shar_quote(&shar->work, u, 1);
			if (g != NULL) {
				archive_strcat(&shar->work, ":");
				shar_quote(&shar->work, g, 1);
			}
			archive_strcat(&shar->work, " ");
			shar_quote(&shar->work,
			    archive_entry_pathname(shar->entry), 1);
			archive_strcat(&shar->work, "\n");
		}

		if ((p = archive_entry_fflags_text(shar->entry)) != NULL) {
			archive_string_sprintf(&shar->work, "chflags %s ", p);
			shar_quote(&shar->work,
			    archive_entry_pathname(shar->entry), 1);
			archive_strcat(&shar->work, "\n");
		}

		/* TODO: restore ACLs */

	} else {
		if (shar->has_data) {
			/* Finish sed-encoded data:  ensure last line ends. */
			if (!shar->end_of_line)
				archive_strappend_char(&shar->work, '\n');
			archive_strcat(&shar->work, "SHAR_END\n");
		}
	}

	archive_entry_free(shar->entry);
	shar->entry = NULL;

	if (shar->work.length < 65536)
		return (ARCHIVE_OK);

	ret = __archive_write_output(a, shar->work.s, shar->work.length);
	if (ret != ARCHIVE_OK)
		return (ARCHIVE_FATAL);
	archive_string_empty(&shar->work);

	return (ARCHIVE_OK);
}